

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O2

void fy_emit_write_indent(fy_emitter *emit,int indent)

{
  undefined8 uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int len;
  size_t __n;
  char *str;
  undefined8 uStack_30;
  char acStack_28 [8];
  
  iVar4 = 0;
  if (0 < indent) {
    iVar4 = indent;
  }
  if ((((emit->flags & 2) == 0) || (iVar3 = emit->column, iVar4 < iVar3)) ||
     ((emit->flags & 1) == 0 && iVar3 == iVar4)) {
    uStack_30 = 0x123e6b;
    fy_emit_putc(emit,fyewt_linebreak,10);
    iVar3 = emit->column;
  }
  len = iVar4 - iVar3;
  if (len != 0 && iVar3 <= iVar4) {
    __n = (size_t)len;
    lVar2 = -(__n + 0x10 & 0xfffffffffffffff0);
    str = acStack_28 + lVar2;
    *(undefined8 *)((long)&uStack_30 + lVar2) = 0x20;
    uVar1 = *(undefined8 *)((long)&uStack_30 + lVar2);
    *(undefined8 *)((long)&uStack_30 + lVar2) = 0x123e95;
    memset(str,(int)uVar1,__n);
    str[__n] = '\0';
    *(undefined8 *)((long)&uStack_30 + lVar2) = 3;
    uVar1 = *(undefined8 *)((long)&uStack_30 + lVar2);
    *(undefined8 *)((long)&uStack_30 + lVar2) = 0x123eab;
    fy_emit_write(emit,(fy_emitter_write_type)uVar1,str,len);
  }
  *(byte *)&emit->flags = (byte)emit->flags | 3;
  return;
}

Assistant:

void fy_emit_write_indent(struct fy_emitter *emit, int indent) {
    int len;
    char *ws;

    indent = indent > 0 ? indent : 0;

    if (!fy_emit_indentation(emit) || emit->column > indent ||
        (emit->column == indent && !fy_emit_whitespace(emit)))
        fy_emit_putc(emit, fyewt_linebreak, '\n');

    if (emit->column < indent) {
        len = indent - emit->column;
        ws = alloca(len + 1);
        memset(ws, ' ', len);
        ws[len] = '\0';
        fy_emit_write(emit, fyewt_indent, ws, len);
    }

    emit->flags |= FYEF_WHITESPACE | FYEF_INDENTATION;
}